

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core_api.c
# Opt level: O3

void mocks_compiles(void)

{
  undefined8 uVar1;
  undefined8 uVar2;
  
  uVar1 = get_test_reporter();
  uVar2 = create_return_value_constraint(1);
  always_expect_(uVar1,"int_stub",
                 "/workspace/llm4binary/github/license_c_cmakelists/cgreen-devs[P]cgreen/tests/api/core_api.c"
                 ,0x30,uVar2,0);
  uVar1 = get_test_reporter();
  uVar2 = create_set_parameter_value_constraint("parameter",1,4);
  always_expect_(uVar1,"int_stub",
                 "/workspace/llm4binary/github/license_c_cmakelists/cgreen-devs[P]cgreen/tests/api/core_api.c"
                 ,0x31,uVar2,0);
  uVar1 = get_test_reporter();
  never_expect_(uVar1,"int_stub",
                "/workspace/llm4binary/github/license_c_cmakelists/cgreen-devs[P]cgreen/tests/api/core_api.c"
                ,0x32,0,0);
  uVar1 = get_test_reporter();
  uVar2 = create_equal_to_value_constraint(1,"1");
  uVar2 = when_("parameter",uVar2);
  expect_(uVar1,"int_stub",
          "/workspace/llm4binary/github/license_c_cmakelists/cgreen-devs[P]cgreen/tests/api/core_api.c"
          ,0x33,uVar2,0);
  uVar1 = get_test_reporter();
  mock_(uVar1,"int_stub",
        "/workspace/llm4binary/github/license_c_cmakelists/cgreen-devs[P]cgreen/tests/api/core_api.c"
        ,0x2b,"parameter",1);
  return;
}

Assistant:

Ensure(mocks_compiles) {
    always_expect(int_stub, will_return(1));
    always_expect(int_stub, will_set_contents_of_output_parameter(parameter, 1, sizeof(int)));
    never_expect(int_stub);
    expect(int_stub, when(parameter, is_equal_to(1)));
    int_stub(1);
}